

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O1

Vector __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::stateDynamics
          (StableIMUFixedContactDynamicalSystem *this,Vector *x,Vector *param_2,TimeIndex param_3)

{
  undefined8 *puVar1;
  double dVar2;
  long lVar3;
  undefined1 (*pauVar4) [16];
  double *pdVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  _func_int *p_Var10;
  char cVar11;
  PointerType ptr;
  _func_int **pp_Var12;
  char *__function;
  ulong uVar13;
  Index extraout_RDX;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar19 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  Vector VVar25;
  Vector xk1;
  Vector3 angularVelocityFlex;
  Vector3 velocityFlex;
  Vector3 positionFlex;
  Vector3 orientationFlexV;
  Vector3 angularAccelerationFlex;
  Vector3 accelerationFlex;
  Quaternion orientationFlex;
  AngleAxis orientationAA;
  DenseStorage<double,__1,__1,_1,_0> local_228;
  undefined1 local_218 [16];
  double local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  double local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined1 local_1b8 [16];
  double local_1a8;
  double local_1a0;
  Vector3 local_198;
  double local_178;
  double dStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158 [4];
  double local_138 [4];
  double local_118;
  double dStack_110;
  Quaternion local_108;
  double local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  AngleAxis<double> local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  double local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  double local_38;
  
  cVar11 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,param_2);
  if (cVar11 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  lVar3 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (2 < lVar3) {
    pauVar4 = (undefined1 (*) [16])
              (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    local_1b8 = *pauVar4;
    local_218 = *pauVar4;
    local_208 = *(double *)pauVar4[1];
    local_1a8 = local_208;
    if (8 < lVar3) {
      local_178 = *(double *)pauVar4[3];
      dStack_170 = *(double *)(pauVar4[3] + 8);
      local_1c8 = *(double *)pauVar4[4];
      local_1d8._0_4_ = SUB84(local_178,0);
      local_1d8._4_4_ = (undefined4)((ulong)local_178 >> 0x20);
      uStack_1d0._0_4_ = SUB84(dStack_170,0);
      uStack_1d0._4_4_ = (undefined4)((ulong)dStack_170 >> 0x20);
      local_68 = (undefined4)local_1d8;
      uStack_64 = local_1d8._4_4_;
      uStack_60 = (undefined4)uStack_1d0;
      uStack_5c = uStack_1d0._4_4_;
      local_1d8 = local_178;
      uStack_1d0 = dStack_170;
      local_168 = local_1c8;
      local_58 = local_1c8;
      local_48 = *(undefined8 *)*pauVar4;
      uStack_40 = *(undefined8 *)(*pauVar4 + 8);
      local_38 = local_208;
      (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                [10])(local_158 + 4,x);
      lVar3 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows;
      if (5 < lVar3) {
        pdVar5 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = pdVar5[3];
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar5[4];
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar5[5];
        if (0xb < lVar3) {
          local_118 = *(double *)*(undefined1 (*) [16])(pdVar5 + 9);
          dStack_110 = pdVar5[10];
          local_1e8 = pdVar5[0xb];
          local_1f8._0_4_ = SUB84(local_118,0);
          local_1f8._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
          local_1f8._8_4_ = SUB84(dStack_110,0);
          local_1f8._12_4_ = (undefined4)((ulong)dStack_110 >> 0x20);
          local_a8 = local_1f8._0_4_;
          uStack_a4 = local_1f8._4_4_;
          uStack_a0 = local_1f8._8_4_;
          uStack_9c = local_1f8._12_4_;
          local_1f8 = *(undefined1 (*) [16])(pdVar5 + 9);
          local_1a0 = local_1e8;
          local_98 = local_1e8;
          local_88 = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
          dStack_80 = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1];
          local_78 = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
          (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[0xb])(local_158,x);
          computeQuaternion_(&local_108,(StableIMUFixedContactDynamicalSystem *)x,&local_198);
          dVar2 = (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
          uStack_200 = 0;
          dVar23 = dVar2 * 0.5 * dVar2;
          local_218._8_8_ = (double)local_218._8_8_ + local_138[1] * dVar23 + dStack_170 * dVar2;
          local_1b8._8_4_ = (int)local_218._8_8_;
          local_1b8._0_8_ = (double)local_218._0_8_ + local_138[0] * dVar23 + local_178 * dVar2;
          local_1b8._12_4_ = (int)((ulong)local_218._8_8_ >> 0x20);
          local_1a8 = local_208 + dVar23 * local_138[2] + local_168 * dVar2;
          local_1d8 = local_138[0] * dVar2 + local_178;
          uStack_1d0 = local_138[1] * dVar2 + dStack_170;
          local_1c8 = local_138[2] * dVar2 + local_168;
          local_218._0_8_ = dVar23 * local_158[0] + local_118 * dVar2;
          local_218._8_8_ = dVar23 * local_158[1] + dStack_110 * dVar2;
          uStack_160 = 0;
          local_208 = dVar23 * local_158[2] + local_1a0 * dVar2;
          dVar23 = local_208 * local_208 +
                   (double)local_218._8_8_ * (double)local_218._8_8_ +
                   (double)local_218._0_8_ * (double)local_218._0_8_;
          local_e8 = 0.0;
          uStack_e0 = 0;
          local_178 = dVar2;
          dStack_170 = dVar2;
          local_168 = dVar2;
          if (dVar23 <= 9.999999999999999e-33) {
            local_208 = 1.0;
            uStack_200 = 0;
            local_218 = ZEXT816(0);
          }
          else {
            if (dVar23 < 0.0) {
              uStack_200 = 0;
              dVar2 = sqrt(dVar23);
              auVar18._12_4_ = extraout_XMM0_Dd;
              auVar18._8_4_ = extraout_XMM0_Dc;
              auVar18._0_8_ = dVar2;
            }
            else {
              auVar18._0_8_ = SQRT(dVar23);
              auVar18._8_8_ = 0;
            }
            local_e8 = auVar18._0_8_;
            auVar6._8_4_ = auVar18._0_4_;
            auVar6._0_8_ = local_e8;
            auVar6._12_4_ = auVar18._4_4_;
            local_218 = divpd(local_218,auVar6);
            local_208 = local_208 / local_e8;
            uStack_e0 = auVar18._8_8_;
            local_e8 = local_e8 * 0.5;
          }
          dVar2 = cos(local_e8);
          local_d8._8_4_ = extraout_XMM0_Dc_00;
          local_d8._0_8_ = dVar2;
          local_d8._12_4_ = extraout_XMM0_Dd_00;
          dVar2 = sin(local_e8);
          dVar24 = local_208 * dVar2;
          dVar23 = dVar2 * (double)local_218._0_8_;
          dVar2 = dVar2 * (double)local_218._8_8_;
          dVar7 = dVar2 * local_108.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[0];
          dVar8 = dVar2 * local_108.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[1];
          dVar17 = dVar23 * local_108.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[0];
          dVar20 = dVar23 * local_108.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[1];
          dVar21 = local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0] * dVar24 -
                   local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[2] * dVar23;
          auVar22._8_4_ = SUB84(dVar21,0);
          auVar22._0_8_ =
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1] * dVar24 -
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3] * dVar23;
          auVar22._12_4_ = (int)((ulong)dVar21 >> 0x20);
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[0] =
               SUB168(auVar22 ^ _DAT_00199020,0) +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[2] * dVar2 +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[0] * (double)local_d8._0_8_;
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[1] =
               SUB168(auVar22 ^ _DAT_00199020,8) +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3] * dVar2 +
               local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1] * (double)local_d8._0_8_;
          dVar17 = dVar17 + dVar24 * local_108.m_coeffs.
                                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                     m_storage.m_data.array[2];
          auVar19._8_4_ = SUB84(dVar17,0);
          auVar19._0_8_ =
               dVar20 + dVar24 * local_108.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[3];
          auVar19._12_4_ = (int)((ulong)dVar17 >> 0x20);
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[2] =
               SUB168(auVar19 ^ _DAT_00199030,0) +
               ((double)local_d8._0_8_ *
                local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2] - dVar7);
          local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[3] =
               SUB168(auVar19 ^ _DAT_00199030,8) +
               ((double)local_d8._0_8_ *
                local_108.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[3] - dVar8);
          dVar2 = dStack_110 + dStack_170 * local_158[1];
          local_1f8._8_4_ = SUB84(dVar2,0);
          local_1f8._0_8_ = local_118 + local_178 * local_158[0];
          local_1f8._12_4_ = (int)((ulong)dVar2 >> 0x20);
          local_1e8 = local_1a0 + local_168 * local_158[2];
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    (&local_228,(DenseStorage<double,__1,__1,_1,_0> *)param_2);
          pdVar5 = local_228.m_data;
          if (2 < local_228.m_rows) {
            uVar13 = 3;
            if (((ulong)local_228.m_data & 7) == 0) {
              uVar13 = (ulong)((uint)((ulong)local_228.m_data >> 3) & 1);
            }
            uVar14 = (uint)(uVar13 ^ 3);
            iVar16 = (int)uVar13;
            if (uVar13 != 0) {
              memcpy(local_228.m_data,local_1b8,(ulong)(uint)(iVar16 * 8));
            }
            if (1 < uVar14) {
              uVar15 = (ulong)(uint)(iVar16 * 8);
              uVar9 = *(undefined8 *)(local_1b8 + uVar15 + 8);
              puVar1 = (undefined8 *)((long)pdVar5 + uVar15);
              *puVar1 = *(undefined8 *)(local_1b8 + uVar15);
              puVar1[1] = uVar9;
            }
            if ((uVar14 & 0xfffffffe) + iVar16 < 3) {
              uVar15 = (ulong)((iVar16 + (uVar14 & 0xfffffffe)) * 8);
              memcpy((void *)((long)pdVar5 + uVar15),local_1b8 + uVar15,
                     ((uVar13 ^ 3) - (ulong)(uVar14 & 0xfffffffe)) * 8);
            }
            pdVar5 = local_228.m_data;
            if (8 < local_228.m_rows) {
              pp_Var12 = (_func_int **)(local_228.m_data + 6);
              uVar13 = 3;
              if (((ulong)pp_Var12 & 7) == 0) {
                uVar13 = (ulong)((uint)((ulong)pp_Var12 >> 3) & 1);
              }
              uVar14 = (uint)(uVar13 ^ 3);
              iVar16 = (int)uVar13;
              if (uVar13 != 0) {
                memcpy(pp_Var12,&local_1d8,(ulong)(uint)(iVar16 * 8));
              }
              if (1 < uVar14) {
                uVar15 = (ulong)(uint)(iVar16 * 8);
                uVar9 = *(undefined8 *)((long)&uStack_1d0 + uVar15);
                puVar1 = (undefined8 *)((long)pdVar5 + uVar15 + 0x30);
                *puVar1 = *(undefined8 *)((long)&local_1d8 + uVar15);
                puVar1[1] = uVar9;
              }
              if ((uVar14 & 0xfffffffe) + iVar16 < 3) {
                uVar15 = (ulong)((iVar16 + (uVar14 & 0xfffffffe)) * 8);
                memcpy((void *)((long)pdVar5 + uVar15 + 0x30),(void *)((long)&local_1d8 + uVar15),
                       ((uVar13 ^ 3) - (ulong)(uVar14 & 0xfffffffe)) * 8);
              }
              if (0xe < local_228.m_rows) {
                pp_Var12 = (_func_int **)(local_228.m_data + 0xc);
                uVar13 = 3;
                if (((ulong)pp_Var12 & 7) == 0) {
                  uVar13 = (ulong)((uint)((ulong)pp_Var12 >> 3) & 1);
                }
                uVar14 = (uint)uVar13 ^ 3;
                if (uVar13 != 0) {
                  uVar15 = 0;
                  do {
                    pp_Var12[uVar15] = (_func_int *)local_158[uVar15 + 4];
                    uVar15 = uVar15 + 1;
                  } while (uVar13 != uVar15);
                }
                uVar15 = (uVar14 & 0xfffffffe) + uVar13;
                if (1 < uVar14) {
                  do {
                    p_Var10 = (_func_int *)local_158[uVar13 + 5];
                    pp_Var12[uVar13] = (_func_int *)local_158[uVar13 + 4];
                    (pp_Var12 + uVar13)[1] = p_Var10;
                    uVar13 = uVar13 + 2;
                  } while (uVar13 < uVar15);
                }
                if ((uint)uVar15 < 3) {
                  do {
                    pp_Var12[uVar15] = (_func_int *)local_158[uVar15 + 4];
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != 3);
                }
                Eigen::AngleAxis<double>::operator=
                          (&local_c8,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_108);
                pdVar5 = local_228.m_data;
                local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] =
                     local_c8.m_angle *
                     local_c8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
                local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] =
                     local_c8.m_angle *
                     local_c8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
                local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_c8.m_angle *
                     local_c8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
                if (5 < local_228.m_rows) {
                  pp_Var12 = (_func_int **)(local_228.m_data + 3);
                  uVar13 = 3;
                  if (((ulong)pp_Var12 & 7) == 0) {
                    uVar13 = (ulong)((uint)((ulong)pp_Var12 >> 3) & 1);
                  }
                  uVar14 = (uint)(uVar13 ^ 3);
                  iVar16 = (int)uVar13;
                  if (uVar13 != 0) {
                    memcpy(pp_Var12,&local_198,(ulong)(uint)(iVar16 * 8));
                  }
                  if (1 < uVar14) {
                    uVar15 = (ulong)(uint)(iVar16 * 8);
                    uVar9 = *(undefined8 *)
                             ((long)local_198.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array + uVar15 + 8);
                    puVar1 = (undefined8 *)((long)pdVar5 + uVar15 + 0x18);
                    *puVar1 = *(undefined8 *)
                               ((long)local_198.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array + uVar15);
                    puVar1[1] = uVar9;
                  }
                  if ((uVar14 & 0xfffffffe) + iVar16 < 3) {
                    uVar15 = (ulong)((iVar16 + (uVar14 & 0xfffffffe)) * 8);
                    memcpy((void *)((long)pdVar5 + uVar15 + 0x18),
                           (void *)((long)local_198.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array + uVar15),
                           ((uVar13 ^ 3) - (ulong)(uVar14 & 0xfffffffe)) * 8);
                  }
                  pdVar5 = local_228.m_data;
                  if (0xb < local_228.m_rows) {
                    pp_Var12 = (_func_int **)(local_228.m_data + 9);
                    uVar13 = 3;
                    if (((ulong)pp_Var12 & 7) == 0) {
                      uVar13 = (ulong)((uint)((ulong)pp_Var12 >> 3) & 1);
                    }
                    uVar14 = (uint)(uVar13 ^ 3);
                    iVar16 = (int)uVar13;
                    if (uVar13 != 0) {
                      memcpy(pp_Var12,local_1f8,(ulong)(uint)(iVar16 * 8));
                    }
                    if (1 < uVar14) {
                      uVar15 = (ulong)(uint)(iVar16 * 8);
                      uVar9 = *(undefined8 *)(local_1f8 + uVar15 + 8);
                      puVar1 = (undefined8 *)((long)pdVar5 + uVar15 + 0x48);
                      *puVar1 = *(undefined8 *)(local_1f8 + uVar15);
                      puVar1[1] = uVar9;
                    }
                    if ((uVar14 & 0xfffffffe) + iVar16 < 3) {
                      uVar15 = (ulong)((iVar16 + (uVar14 & 0xfffffffe)) * 8);
                      memcpy((void *)((long)pdVar5 + uVar15 + 0x48),local_1f8 + uVar15,
                             ((uVar13 ^ 3) - (ulong)(uVar14 & 0xfffffffe)) * 8);
                    }
                    if (0x11 < local_228.m_rows) {
                      pp_Var12 = (_func_int **)(local_228.m_data + 0xf);
                      uVar13 = 3;
                      if (((ulong)pp_Var12 & 7) == 0) {
                        uVar13 = (ulong)((uint)((ulong)pp_Var12 >> 3) & 1);
                      }
                      uVar14 = (uint)uVar13 ^ 3;
                      if (uVar13 != 0) {
                        uVar15 = 0;
                        do {
                          pp_Var12[uVar15] = (_func_int *)local_158[uVar15];
                          uVar15 = uVar15 + 1;
                        } while (uVar13 != uVar15);
                      }
                      uVar15 = (uVar14 & 0xfffffffe) + uVar13;
                      if (1 < uVar14) {
                        do {
                          p_Var10 = (_func_int *)local_158[uVar13 + 1];
                          pp_Var12[uVar13] = (_func_int *)local_158[uVar13];
                          (pp_Var12 + uVar13)[1] = p_Var10;
                          uVar13 = uVar13 + 2;
                        } while (uVar13 < uVar15);
                      }
                      if ((uint)uVar15 < 3) {
                        do {
                          pp_Var12[uVar15] = (_func_int *)local_158[uVar15];
                          uVar15 = uVar15 + 1;
                        } while (uVar15 != 3);
                      }
                      pdVar5 = x[0x12].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
                      if (pdVar5 == (double *)0x0) {
                        (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                             (_func_int **)local_228.m_data;
                        (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                             (_func_int **)local_228.m_rows;
                        local_228.m_data = (double *)0x0;
                        local_228.m_rows = 0;
                      }
                      else {
                        (**(code **)((long)*pdVar5 + 0x10))(this,pdVar5,&local_228);
                      }
                      free(local_228.m_data);
                      VVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows = extraout_RDX;
                      VVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data = (double *)this;
                      return (Vector)VVar25.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage;
                    }
                  }
                }
              }
            }
          }
          __function = 
          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
          ;
          goto LAB_0015486a;
        }
      }
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0015486a:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector StableIMUFixedContactDynamicalSystem::stateDynamics(const Vector & x, const Vector &, TimeIndex)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  // Vector3 accelerationFlex(x.segment(indexes::linAcc,3));
  Vector3 accelerationFlex(stabilizeAccelerationLinear(positionFlex, velocityFlex));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  // Vector3 angularAccelerationFlex(x.segment(indexes::angAcc,3));
  Vector3 angularAccelerationFlex(stabilizeAccelerationAngular(orientationFlexV, angularVelocityFlex));

  Quaternion orientationFlex(computeQuaternion_(orientationFlexV));

  kine::integrateKinematics(positionFlex, velocityFlex, accelerationFlex, orientationFlex, angularVelocityFlex,
                            angularAccelerationFlex, dt_);

  // x_{k+1}
  Vector xk1(x);

  xk1.segment(indexes::pos, 3) = positionFlex;
  xk1.segment(indexes::linVel, 3) = velocityFlex;
  xk1.segment(indexes::linAcc, 3) = accelerationFlex;

  AngleAxis orientationAA(orientationFlex);
  orientationFlexV = orientationAA.angle() * orientationAA.axis();

  xk1.segment(indexes::ori, 3) = orientationFlexV;
  xk1.segment(indexes::angVel, 3) = angularVelocityFlex;
  xk1.segment(indexes::angAcc, 3) = angularAccelerationFlex;

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}